

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

int meatobj(monst *mtmp)

{
  short sVar1;
  obj *poVar2;
  int iVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  permonst *ppVar10;
  uint uVar11;
  obj *obj;
  obj *otmp3;
  obj *obj_00;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  int local_14c;
  char buf [256];
  
  buf[0] = '\0';
  uVar7 = 0;
  if (mtmp->mtame == '\0') {
    local_14c = 0;
    iVar3 = 0;
    poVar2 = level->objects[mtmp->mx][mtmp->my];
LAB_001dbf81:
    obj = poVar2;
    if (obj != (obj *)0x0) {
      poVar2 = (obj->v).v_nexthere;
      if ((((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) < 0x90) &&
          (bVar4 = obj_resists(obj,5,0x5f), bVar4 == '\0')) &&
         (iVar5 = touch_artifact(obj,mtmp), iVar5 != 0)) goto code_r0x001dbfdb;
      if ((((obj->oclass != '\x0e') && (obj != uball)) && (obj != uchain)) &&
         (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
        if (iVar3 == 0) {
          pcVar8 = Monnam(mtmp);
          pcVar9 = distant_name(obj,doname);
          sprintf(buf,"%s engulfs %s.",pcVar8,pcVar9);
        }
        else if (iVar3 + 1 == 2) {
          pcVar8 = Monnam(mtmp);
          sprintf(buf,"%s engulfs several objects.",pcVar8);
        }
        obj_extract_self(obj);
        mpickobj(mtmp,obj);
        iVar3 = iVar3 + 1;
      }
      goto LAB_001dc2e3;
    }
    if (0 < iVar3) {
      if ((((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) || (flags.verbose == '\0')) ||
         (buf[0] == '\0')) {
        if (flags.soundok != '\0' && flags.verbose != '\0') {
          pcVar8 = "several";
          if (iVar3 == 1) {
            pcVar8 = "a";
          }
          pcVar9 = "s";
          if (iVar3 == 1) {
            pcVar9 = "";
          }
          You_hear("%s slurping sound%s.",pcVar8,pcVar9);
        }
      }
      else {
        pline("%s",buf);
      }
    }
    uVar7 = (uint)(0 < local_14c || 0 < iVar3);
  }
  return uVar7;
code_r0x001dbfdb:
  sVar1 = obj->otyp;
  if ((((sVar1 != 0xb4) && (sVar1 != 0xcb)) &&
      ((sVar1 != 0x10e || ((1 < obj->corpsenm - 0xbU || ((mtmp->mintrinsics & 0x80) != 0)))))) &&
     (((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0 || ((ushort)(sVar1 - 0xdaU) < 3)))) {
    if ((flags.verbose != '\0' & (byte)viz_array[mtmp->my][mtmp->mx] >> 1) == 1) {
      pcVar8 = Monnam(mtmp);
      pcVar9 = distant_name(obj,doname);
      pline("%s eats %s!",pcVar8,pcVar9);
    }
    else if (flags.soundok != '\0' && flags.verbose != '\0') {
      You_hear("a slurping sound.");
    }
    iVar5 = mtmp->mhpmax;
    if (mtmp->mhp < iVar5) {
      iVar6 = mtmp->mhp + (uint)objects[obj->otyp].oc_weight;
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      mtmp->mhp = iVar6;
    }
    obj_00 = obj->cobj;
    if (obj_00 != (obj *)0x0) {
      while (obj_00 != (obj *)0x0) {
        obj_extract_self(obj_00);
        if ((obj->otyp == 0xdd) && (obj_00->otyp == 0x10e)) {
          obj_00->age = moves - obj_00->age;
          start_corpse_timeout(obj_00);
        }
        mpickobj(mtmp,obj_00);
        obj_00 = obj->cobj;
      }
    }
    uVar12 = 0;
    uVar7 = (ushort)obj->otyp - 0x10e;
    if ((uVar7 < 0x1c) && ((0x8000003U >> (uVar7 & 0x1f) & 1) != 0)) {
      uVar11 = obj->corpsenm - 0x117;
      if (uVar11 < 0x3f) {
        uVar12 = 0x4002000000000001 >> ((byte)uVar11 & 0x3f);
      }
      else {
        uVar12 = 0;
      }
    }
    bVar13 = false;
    if ((uVar7 < 0x1c) && ((0x8000003U >> (uVar7 & 0x1f) & 1) != 0)) {
      bVar13 = obj->corpsenm == 0xec;
    }
    bVar14 = false;
    if ((uVar7 < 0x1c) && ((0x8000003U >> (uVar7 & 0x1f) & 1) != 0)) {
      bVar14 = obj->corpsenm == 0x119;
    }
    delobj(obj);
    ppVar10 = mtmp->data;
    if ((uVar12 & 1) == 0) {
      if (bVar13) {
        ppVar10 = grow_up(mtmp,(monst *)0x0);
      }
      else if (bVar14) {
        mtmp->mhp = mtmp->mhpmax;
      }
    }
    else {
      iVar5 = newcham(level,mtmp,(permonst *)0x0,'\0','\0');
      if (iVar5 != 0) {
        ppVar10 = mtmp->data;
      }
    }
    if (ppVar10 != mons + 10) {
      return (ppVar10 == (permonst *)0x0) + 1;
    }
    local_14c = local_14c + 1;
LAB_001dc2e3:
    if ((mtmp->field_0x60 & 2) != 0) {
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
  }
  goto LAB_001dbf81;
}

Assistant:

int meatobj(struct monst *mtmp)
{
	struct obj *otmp, *otmp2;
	const struct permonst *ptr;
	int poly, grow, heal, count = 0, ecount = 0;
	char buf[BUFSZ];

	buf[0] = '\0';
	/* If a pet, eating is handled separately, in dog.c */
	if (mtmp->mtame) return 0;

	/* Eats organic objects, including cloth and wood, if there */
	/* Engulfs others, except huge rocks and metal attached to player */
	for (otmp = level->objects[mtmp->mx][mtmp->my]; otmp; otmp = otmp2) {
	    otmp2 = otmp->nexthere;
	    if (is_organic(otmp) && !obj_resists(otmp, 5, 95) &&
		    touch_artifact(otmp,mtmp)) {
		if (otmp->otyp == CORPSE && touch_petrifies(&mons[otmp->corpsenm]) &&
			!resists_ston(mtmp))
		    continue;
		if (otmp->otyp == AMULET_OF_STRANGULATION ||
				otmp->otyp == RIN_SLOW_DIGESTION)
		    continue;
		if (Is_prize(otmp))
		    continue;
		++count;
		if (cansee(mtmp->mx,mtmp->my) && flags.verbose)
		    pline("%s eats %s!", Monnam(mtmp),
			    distant_name(otmp, doname));
		else if (flags.soundok && flags.verbose)
		    You_hear("a slurping sound.");
		/* Heal up to the object's weight in hp */
		if (mtmp->mhp < mtmp->mhpmax) {
		    mtmp->mhp += objects[otmp->otyp].oc_weight;
		    if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;
		}
		if (Has_contents(otmp)) {
		    struct obj *otmp3;
		    /* contents of eaten containers become engulfed; this
		       is arbitrary, but otherwise g.cubes are too powerful */
		    while ((otmp3 = otmp->cobj) != 0) {
			obj_extract_self(otmp3);
			if (otmp->otyp == ICE_BOX && otmp3->otyp == CORPSE) {
			    otmp3->age = moves - otmp3->age;
			    start_corpse_timeout(otmp3);
			}
			mpickobj(mtmp, otmp3);
		    }
		}
		poly = polyfodder(otmp);
		grow = mlevelgain(otmp);
		heal = mhealup(otmp);
		delobj(otmp);		/* munch */
		ptr = mtmp->data;
		if (poly) {
		    if (newcham(level, mtmp, NULL, FALSE, FALSE))
			ptr = mtmp->data;
		} else if (grow) {
		    ptr = grow_up(mtmp, NULL);
		} else if (heal) {
		    mtmp->mhp = mtmp->mhpmax;
		}
		/* in case it polymorphed or died */
		if (ptr != &mons[PM_GELATINOUS_CUBE])
		    return !ptr ? 2 : 1;
	    } else if (otmp->oclass != ROCK_CLASS &&
		       otmp != uball && otmp != uchain &&
		       !Is_prize(otmp)) {
		++ecount;
		if (ecount == 1) {
			sprintf(buf, "%s engulfs %s.", Monnam(mtmp),
			    distant_name(otmp,doname));
		} else if (ecount == 2)
			sprintf(buf, "%s engulfs several objects.", Monnam(mtmp));
		obj_extract_self(otmp);
		mpickobj(mtmp, otmp);	/* slurp */
	    }
	    /* Engulf & devour is instant, so don't set meating */
	    if (mtmp->minvis) newsym(mtmp->mx, mtmp->my);
	}
	if (ecount > 0) {
	    if (cansee(mtmp->mx, mtmp->my) && flags.verbose && buf[0])
		pline("%s", buf);
	    else if (flags.soundok && flags.verbose)
	    	You_hear("%s slurping sound%s.",
			ecount == 1 ? "a" : "several",
			ecount == 1 ? "" : "s");
	}
	return ((count > 0) || (ecount > 0)) ? 1 : 0;
}